

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HEkk::debugNonbasicFreeColumnSet(HEkk *this,HighsInt num_free_col,HSet *nonbasic_free_col_set)

{
  double dVar1;
  HighsOptions *pHVar2;
  pointer pcVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  HighsInt iVar;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *format;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  pHVar2 = this->options_;
  if ((pHVar2->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  uVar12 = (this->lp_).num_row_ + (this->lp_).num_col_;
  uVar9 = 0;
  uVar11 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar11 = uVar9;
  }
  iVar7 = 0;
  for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    if (((this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[uVar9] <= -INFINITY) &&
       (INFINITY <=
        (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9])) {
      iVar7 = iVar7 + 1;
    }
  }
  if (iVar7 == num_free_col) {
    if (num_free_col == 0) {
      return kOk;
    }
    bVar6 = HSet::debug(nonbasic_free_col_set);
    if (!bVar6) {
      highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
                  "NonbasicFreeColumnData: HSet error\n");
      return kLogicalError;
    }
    pcVar3 = (this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    for (uVar9 = 0; iVar7 = (int)uVar8, uVar11 != uVar9; uVar9 = uVar9 + 1) {
      if ((pcVar3[uVar9] == '\x01') && (pdVar4[uVar9] <= -INFINITY)) {
        uVar8 = (ulong)((iVar7 + 1) - (uint)(pdVar5[uVar9] < INFINITY));
      }
    }
    if (iVar7 == nonbasic_free_col_set->count_) {
      if (iVar7 < 1) {
        uVar8 = 0;
      }
      uVar11 = 0;
      do {
        if (uVar8 == uVar11) {
          return kOk;
        }
        uVar12 = (nonbasic_free_col_set->entry_).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11];
        uVar10 = (uint)pcVar3[(int)uVar12];
        uVar9 = (ulong)uVar10;
        dVar1 = pdVar4[(int)uVar12];
        if (uVar10 != 1) goto LAB_00335fb2;
      } while ((dVar1 <= -INFINITY) && (uVar11 = uVar11 + 1, INFINITY <= pdVar5[(int)uVar12]));
      uVar9 = 1;
LAB_00335fb2:
      highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,
                  "NonbasicFreeColumnData: Variable %d in nonbasic free set has nonbasicFlag = %d and bounds [%g, %g]\n"
                  ,dVar1,pdVar5[(int)uVar12],(ulong)uVar12,uVar9);
      return kLogicalError;
    }
    format = "NonbasicFreeColumnData: Set should have %d entries, not %d\n";
  }
  else {
    format = "NonbasicFreeColumnData: Number of free columns should be %d, not %d\n";
  }
  highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kInfo,format);
  return kLogicalError;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicFreeColumnSet(
    const HighsInt num_free_col, const HSet nonbasic_free_col_set) const {
  const HighsOptions& options = *(this->options_);
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const HighsSimplexInfo& info = this->info_;
  const SimplexBasis& basis = this->basis_;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;

  // Check the number of free columns
  HighsInt check_num_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (info.workLower_[iVar] <= -kHighsInf &&
        info.workUpper_[iVar] >= kHighsInf)
      check_num_free_col++;
  }
  if (check_num_free_col != num_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Number of free columns should be "
                "%" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT "\n",
                check_num_free_col, num_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  if (!num_free_col) return HighsDebugStatus::kOk;
  // Debug HSet nonbasic_free_col
  bool nonbasic_free_col_ok = nonbasic_free_col_set.debug();
  if (!nonbasic_free_col_ok) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: HSet error\n");
    return HighsDebugStatus::kLogicalError;
  }

  // Check that we have the right number of nonbasic free columns
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  HighsInt check_num_nonbasic_free_col = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (nonbasic_free) check_num_nonbasic_free_col++;
  }
  if (check_num_nonbasic_free_col != num_nonbasic_free_col) {
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "NonbasicFreeColumnData: Set should have %" HIGHSINT_FORMAT
                " entries, not %" HIGHSINT_FORMAT "\n",
                check_num_nonbasic_free_col, num_nonbasic_free_col);
    return HighsDebugStatus::kLogicalError;
  }
  // Check that all in the set are nonbasic free columns
  const vector<HighsInt>& nonbasic_free_col_set_entry =
      nonbasic_free_col_set.entry();
  for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
    HighsInt iVar = nonbasic_free_col_set_entry[ix];
    bool nonbasic_free = basis.nonbasicFlag_[iVar] == kNonbasicFlagTrue &&
                         info.workLower_[iVar] <= -kHighsInf &&
                         info.workUpper_[iVar] >= kHighsInf;
    if (!nonbasic_free) {
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "NonbasicFreeColumnData: Variable %" HIGHSINT_FORMAT
                  " in nonbasic free "
                  "set has nonbasicFlag = %" HIGHSINT_FORMAT
                  " and bounds [%g, %g]\n",
                  iVar, basis.nonbasicFlag_[iVar], info.workLower_[iVar],
                  info.workUpper_[iVar]);
      return HighsDebugStatus::kLogicalError;
    }
  }
  return HighsDebugStatus::kOk;
}